

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.c
# Opt level: O1

BOOL pattern_range(char *pattern,int which,PatternRange *range)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *p;
  char cVar6;
  
  iVar4 = (int)pattern;
  do {
    if (*pattern == '\0') {
      return FALSE;
    }
    iVar5 = (int)pattern + -1;
    pattern = pattern + -1;
    do {
      pbVar1 = (byte *)(pattern + 1);
      pattern = pattern + 1;
      iVar5 = iVar5 + 1;
    } while ((*pbVar1 & 0xfe) == 0x30);
    range->index = iVar5 - iVar4;
    cVar6 = *pattern;
    if (cVar6 != '\0') {
      cVar2 = *pattern;
      do {
        if (cVar6 != cVar2) break;
        cVar6 = pattern[1];
        pattern = pattern + 1;
      } while (cVar6 != '\0');
    }
    range->length = (int)pattern - iVar5;
    bVar3 = which < 2;
    which = which + -1;
    if (bVar3) {
      return TRUE;
    }
  } while( true );
}

Assistant:

BOOL
pattern_range (const char *pattern, int which, PatternRange *range)
{
  const char *p = pattern, *p2;

  do
    {
      if (*p == '\0')
	return FALSE;

      /* Skip to first sequence. */
      for (; *p != '\0' && (*p == '0' || *p == '1'); p++)
	;

      /* Remember where the pattern started. */
      range->index = p - pattern;
      p2 = p;

      /* Find the end of the sequence. */
      for (; *p != '\0' && *p == *p2; p++)
	;

      /* Remember the length of the pattern. */
      range->length = p - p2;
    }
  while (--which > 0);

  return TRUE;
}